

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O1

void __thiscall despot::AEMS::BeliefUpdate(AEMS *this,ACT_TYPE action,OBS_TYPE obs)

{
  VNode *pVVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  QNode *pQVar5;
  VNode *this_00;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_01;
  Belief *pBVar6;
  undefined4 extraout_var;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  pVar7;
  OBS_TYPE local_38;
  
  local_38 = obs;
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"- Updating belief, history and root with action ",0x30);
      poVar4 = (ostream *)std::ostream::operator<<(plVar3,action);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," and observation ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"...",3);
    }
  }
  pVVar1 = this->root_;
  if (this->reuse_ == true) {
    pQVar5 = VNode::Child(pVVar1,action);
    this_00 = QNode::Child(pQVar5,local_38);
    pQVar5 = VNode::Child(this->root_,action);
    this_01 = &QNode::children(pQVar5)->_M_t;
    pVar7 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
            ::equal_range(this_01,&local_38);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
    ::_M_erase_aux(this_01,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
    pVVar1 = this->root_;
    if (pVVar1 != (VNode *)0x0) {
      VNode::~VNode(pVVar1);
      operator_delete(pVVar1,0x98);
    }
    this->root_ = this_00;
    this_00->likelihood = 1.0;
    VNode::parent(this_00,(QNode *)0x0);
    pBVar6 = VNode::belief(this->root_);
    (this->super_Solver).belief_ = pBVar6;
  }
  else {
    if (pVVar1 != (VNode *)0x0) {
      VNode::~VNode(pVVar1);
      operator_delete(pVVar1,0x98);
    }
    this->root_ = (VNode *)0x0;
    iVar2 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x1c])
                      (this->model_,(this->super_Solver).belief_,action,local_38);
    pBVar6 = (this->super_Solver).belief_;
    if (pBVar6 != (Belief *)0x0) {
      (*pBVar6->_vptr_Belief[1])();
    }
    (this->super_Solver).belief_ = (Belief *)CONCAT44(extraout_var,iVar2);
  }
  History::Add(&(this->super_Solver).history_,action,local_38);
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar3 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"Done!",5);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void AEMS::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	logi << "- Updating belief, history and root with action " << action
		<< " and observation " << obs << "...";

	if (reuse_) {
		VNode* node = root_->Child(action)->Child(obs);
		root_->Child(action)->children().erase(obs);
		delete root_;
		root_ = node;
		root_->likelihood = 1.0;
		root_->parent(NULL);

		belief_ = root_->belief();
	} else {
		delete root_;
		root_ = NULL;

		Belief* new_belief = model_->Tau(belief_, action, obs);
		delete belief_;
		belief_ = new_belief;

		// belief_->Update(action, obs); // approx update
	}

	history_.Add(action, obs);

	logi << "Done!" << endl;
}